

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshifter.cpp
# Opt level: O0

EffectState * __thiscall
anon_unknown.dwarf_1421bc::FshifterStateFactory::create(FshifterStateFactory *this)

{
  EffectState *__s;
  FshifterState *in_stack_000000b0;
  size_t in_stack_fffffffffffffff0;
  
  __s = (EffectState *)(anonymous_namespace)::FshifterState::operator_new(in_stack_fffffffffffffff0)
  ;
  memset(__s,0,0x10150);
  FshifterState::FshifterState(in_stack_000000b0);
  return __s;
}

Assistant:

EffectState *create() override { return new FshifterState{}; }